

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O3

char * tokenise_search_path(char *searchpath)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *__s1;
  char *__s;
  
  __s = "";
  if (searchpath != (char *)0x0) {
    __s = searchpath;
  }
  sVar2 = strlen(__s);
  pcVar3 = (char *)malloc(sVar2 + 5);
  if (pcVar3 == (char *)0x0) {
    return (char *)0x0;
  }
  if (sVar2 != 0) {
    uVar6 = 0;
    uVar10 = 0;
    do {
      iVar1 = (int)uVar6;
      if ((uVar6 < sVar2 - 1) && (__s[uVar6] == ':')) {
        uVar4 = iVar1 + 1;
        cVar7 = ':';
        uVar11 = uVar10;
        if (__s[uVar4] != ':') goto LAB_00130612;
LAB_0013077f:
        uVar10 = (ulong)((int)uVar11 + 1);
        pcVar3[uVar11] = cVar7;
      }
      else {
LAB_00130612:
        if ((iVar1 == 0) || (__s[iVar1 - 1] == ':')) {
          __s1 = __s + uVar6;
          iVar1 = strncmp(__s1,"http:",5);
          if ((iVar1 == 0) ||
             ((((iVar1 = strncmp(__s1,"ftp:",4), iVar1 == 0 ||
                (iVar1 = strncmp(__s1,"|http:",6), iVar1 == 0)) ||
               (iVar1 = strncmp(__s1,"|ftp:",5), iVar1 == 0)) ||
              ((iVar1 = strncmp(__s1,"URL=http:",9), iVar1 == 0 ||
               (iVar1 = strncmp(__s1,"URL=ftp:",8), iVar1 == 0)))))) {
            do {
              uVar4 = (uint)uVar6;
              cVar7 = __s[uVar6];
              pcVar3[uVar10] = cVar7;
              iVar1 = (int)uVar10;
              if (sVar2 <= uVar6) goto LAB_001306e0;
              uVar4 = uVar4 + 1;
              uVar6 = (ulong)uVar4;
              uVar10 = (ulong)(iVar1 + 1);
            } while (cVar7 != ':');
            cVar7 = __s[uVar6];
LAB_001306e0:
            uVar4 = (cVar7 == ':') + uVar4;
            uVar6 = (ulong)uVar4;
            uVar8 = iVar1 + 1U;
            if (__s[uVar6] == '/') {
              uVar6 = (ulong)(uVar4 + 1);
              uVar8 = iVar1 + 2;
              pcVar3[iVar1 + 1U] = '/';
              if (__s[uVar6] == '/') {
                uVar6 = (ulong)(uVar4 + 2);
                pcVar3[uVar8] = '/';
                uVar8 = iVar1 + 3;
              }
            }
            cVar7 = __s[uVar6];
            uVar4 = (int)uVar6 + 3;
            do {
              uVar5 = uVar4;
              uVar9 = uVar8;
              pcVar3[uVar9] = cVar7;
              cVar7 = __s[uVar5 - 2];
              if ((sVar2 <= uVar5 - 2) || (cVar7 == ':')) break;
              uVar8 = uVar9 + 1;
              uVar4 = uVar5 + 1;
            } while (cVar7 != '/');
            uVar6 = (ulong)(uVar5 - 1);
            uVar10 = (ulong)(uVar9 + 2);
            pcVar3[uVar9 + 1] = cVar7;
            if (__s[uVar6] == ':') {
              uVar6 = (ulong)uVar5;
            }
          }
        }
        uVar4 = (uint)uVar6;
        cVar7 = __s[uVar6];
        uVar11 = uVar10;
        if (cVar7 != ':') goto LAB_0013077f;
        if ((int)uVar10 == 0) {
          uVar10 = 0;
        }
        else if (pcVar3[(int)uVar10 - 1] != '\0') {
          cVar7 = '\0';
          goto LAB_0013077f;
        }
      }
      uVar6 = (ulong)(uVar4 + 1);
    } while (uVar6 < sVar2);
    if ((int)uVar10 != 0) {
      uVar4 = (int)uVar10 + 1;
      pcVar3[uVar10] = '\0';
      goto LAB_001307b1;
    }
  }
  uVar4 = 0;
LAB_001307b1:
  pcVar3[uVar4] = '.';
  pcVar3[uVar4 + 1] = '/';
  pcVar3[uVar4 + 2] = '\0';
  pcVar3[uVar4 + 3] = '\0';
  return pcVar3;
}

Assistant:

char *tokenise_search_path(char *searchpath) {
    char *newsearch;
    unsigned int i, j;
    size_t len;
#ifdef _WIN32
    char path_sep = ';';
#else
    char path_sep = ':';
#endif

    if (!searchpath)
	searchpath="";

    newsearch = (char *)malloc((len = strlen(searchpath))+5);
    if (!newsearch)
	return NULL;

    for (i = 0, j = 0; i < len; i++) {
	/* "::" => ":". Used for escaping colons in http://foo */
	if (i < len-1 && searchpath[i] == ':' && searchpath[i+1] == ':') {
	    newsearch[j++] = ':';
	    i++;
	    continue;
	}

	/* Handle http:// and ftp:// too without :: */
	if (path_sep == ':') {
	    if ((i == 0 || (i > 0 && searchpath[i-1] == ':')) &&
		(!strncmp(&searchpath[i], "http:",     5) ||
		 !strncmp(&searchpath[i], "ftp:",      4) ||
		 !strncmp(&searchpath[i], "|http:",    6) ||
		 !strncmp(&searchpath[i], "|ftp:",     5) ||
		 !strncmp(&searchpath[i], "URL=http:", 9) ||
		 !strncmp(&searchpath[i], "URL=ftp:",  8))) {
		do {
		    newsearch[j++] = searchpath[i];
		} while (i<len && searchpath[i++] != ':');
		if (searchpath[i] == ':')
		    i++;
		if (searchpath[i]=='/')
		    newsearch[j++] = searchpath[i++];
		if (searchpath[i]=='/')
		    newsearch[j++] = searchpath[i++];
		// Look for host:port
		do {
		    newsearch[j++] = searchpath[i++];
		} while (i<len && searchpath[i] != ':' && searchpath[i] != '/');
		newsearch[j++] = searchpath[i++];
		if (searchpath[i] == ':')
		    i++;
	    }
	}

	if (searchpath[i] == path_sep) {
	    /* Skip blank path components */
	    if (j && newsearch[j-1] != 0)
		newsearch[j++] = 0;
	} else {
	    newsearch[j++] = searchpath[i];
	}
    }

    if (j)
	newsearch[j++] = 0;
    newsearch[j++] = '.';
    newsearch[j++] = '/';
    newsearch[j++] = 0;
    newsearch[j++] = 0;
    
    return newsearch;
}